

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::Q3BSPFileImporter::createMaterialMap(Q3BSPFileImporter *this,Q3BSPModel *pModel)

{
  int iVar1;
  int iVar2;
  pointer ppsVar3;
  ostream *poVar4;
  iterator iVar5;
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *this_00;
  mapped_type *ppvVar6;
  ulong uVar7;
  sQ3BSPFace *pQ3BSPFace;
  string key;
  string local_1c8 [32];
  ostringstream str;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"",(allocator<char> *)&str);
  uVar7 = 0;
  do {
    ppsVar3 = (pModel->m_Faces).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pModel->m_Faces).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3 >> 3) <= uVar7) {
      std::__cxx11::string::~string((string *)&key);
      return;
    }
    pQ3BSPFace = ppsVar3[uVar7];
    iVar1 = pQ3BSPFace->iTextureID;
    iVar2 = pQ3BSPFace->iLightmapID;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar4 = (ostream *)std::ostream::operator<<((ostringstream *)&str,iVar1);
    poVar4 = std::operator<<(poVar4,".");
    std::ostream::operator<<(poVar4,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&key,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
            ::find(&(this->m_MaterialLookupMap)._M_t,&key);
    if (&(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header ==
        (_Rb_tree_header *)iVar5._M_node) {
      this_00 = (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *
                )operator_new(0x18);
      (this_00->
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>)
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>)
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
                ::operator[](&this->m_MaterialLookupMap,&key);
      *ppvVar6 = this_00;
    }
    else {
      this_00 = *(vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                  **)(iVar5._M_node + 2);
      if (this_00 ==
          (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *)0x0)
      {
        __assert_fail("nullptr != pCurFaceArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                      ,0x220,
                      "void Assimp::Q3BSPFileImporter::createMaterialMap(const Q3BSP::Q3BSPModel *)"
                     );
      }
    }
    std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
    push_back(this_00,&pQ3BSPFace);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Q3BSPFileImporter::createMaterialMap( const Q3BSP::Q3BSPModel *pModel ) {
    std::string key( "" );
    std::vector<sQ3BSPFace*> *pCurFaceArray = NULL;
    for ( size_t idx = 0; idx < pModel->m_Faces.size(); idx++ )
    {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = pModel->m_Faces[ idx ];
        const int texId = pQ3BSPFace->iTextureID;
        const int lightMapId = pQ3BSPFace->iLightmapID;
        createKey( texId, lightMapId, key );
        FaceMapIt it = m_MaterialLookupMap.find( key );
        if ( m_MaterialLookupMap.end() == it ) {
            pCurFaceArray = new std::vector<Q3BSP::sQ3BSPFace*>;
            m_MaterialLookupMap[ key ] = pCurFaceArray;
        }
        else
        {
            pCurFaceArray = (*it).second;
        }
        ai_assert( nullptr != pCurFaceArray );
        if (nullptr != pCurFaceArray )
        {
            pCurFaceArray->push_back( pQ3BSPFace );
        }
    }
}